

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingPriorityQueue.hpp
# Opt level: O2

void __thiscall
gmlc::containers::BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
::push<helics::action_message_def::action_t>
          (BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this,
          action_t *val)

{
  vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *this_00;
  bool bVar1;
  bool expEmpty;
  unique_lock<std::mutex> pushLock;
  unique_lock<std::mutex> pullLock;
  ActionMessage local_d8;
  
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&pushLock,(mutex_type *)this)
  ;
  this_00 = &this->pushElements;
  if ((this->pushElements).
      super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->pushElements).
      super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    expEmpty = true;
    bVar1 = CLI::std::atomic<bool>::compare_exchange_strong
                      (&this->queueEmptyFlag,&expEmpty,false,seq_cst);
    if (bVar1) {
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&pushLock);
      std::unique_lock<std::mutex>::unique_lock
                ((unique_lock<std::mutex> *)&pullLock,(mutex_type *)&this->m_pullLock);
      LOCK();
      (this->queueEmptyFlag)._M_base._M_i = false;
      UNLOCK();
      if ((this->pullElements).
          super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (this->pullElements).
          super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        helics::ActionMessage::ActionMessage(&local_d8,*val);
        std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
        emplace_back<helics::ActionMessage>
                  ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                   &this->pullElements,&local_d8);
      }
      else {
        std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&pushLock);
        helics::ActionMessage::ActionMessage(&local_d8,*val);
        std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
        emplace_back<helics::ActionMessage>
                  ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)this_00,
                   &local_d8);
      }
      helics::ActionMessage::~ActionMessage(&local_d8);
      std::condition_variable::notify_all();
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&pullLock);
    }
    else {
      helics::ActionMessage::ActionMessage(&local_d8,*val);
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
      emplace_back<helics::ActionMessage>
                ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)this_00,
                 &local_d8);
      helics::ActionMessage::~ActionMessage(&local_d8);
      expEmpty = true;
      bVar1 = CLI::std::atomic<bool>::compare_exchange_strong
                        (&this->queueEmptyFlag,&expEmpty,false,seq_cst);
      if (bVar1) {
        std::condition_variable::notify_all();
      }
    }
  }
  else {
    helics::ActionMessage::ActionMessage(&local_d8,*val);
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
    emplace_back<helics::ActionMessage>
              ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)this_00,
               &local_d8);
    helics::ActionMessage::~ActionMessage(&local_d8);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&pushLock);
  return;
}

Assistant:

void push(Z&& val)  // forwarding reference
        {
            std::unique_lock<MUTEX> pushLock(
                m_pushLock);  // only one lock on this branch
            if (pushElements.empty()) {
                bool expEmpty = true;
                if (queueEmptyFlag.compare_exchange_strong(expEmpty, false)) {
                    // release the push lock so we don't get a potential
                    // deadlock condition
                    pushLock.unlock();
                    std::unique_lock<MUTEX> pullLock(
                        m_pullLock);  // first pullLock
                    queueEmptyFlag = false;
                    if (pullElements.empty()) {
                        pullElements.push_back(std::forward<Z>(val));
                        // pullLock.unlock ();
                    } else {
                        pushLock.lock();
                        pushElements.push_back(std::forward<Z>(val));
                    }
                    condition.notify_all();
                    return;
                } else {
                    pushElements.push_back(std::forward<Z>(val));
                    expEmpty = true;
                    if (queueEmptyFlag.compare_exchange_strong(
                            expEmpty, false)) {
                        condition.notify_all();
                    }
                    return;
                }
            }
            pushElements.push_back(std::forward<Z>(val));
        }